

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkSpecializationMapEntry * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSpecializationMapEntry>
          (Impl *this,VkSpecializationMapEntry *src,size_t count,ScratchAllocator *alloc)

{
  VkSpecializationMapEntry *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkSpecializationMapEntry>(alloc,count);
    if (pVVar1 != (VkSpecializationMapEntry *)0x0) {
      pVVar1 = (VkSpecializationMapEntry *)memmove(pVVar1,src,count << 4);
      return pVVar1;
    }
  }
  return (VkSpecializationMapEntry *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}